

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

_Bool f64_is_zon2(union_float64 a,union_float64 b)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = __fpclassify(a.h);
  if ((iVar1 == 4) || (iVar1 == 2)) {
    iVar1 = __fpclassify(b.h);
    _Var2 = (iVar1 - 2U & 0xfffffffd) == 0;
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

static inline bool f64_is_zon2(union_float64 a, union_float64 b)
{
    if (QEMU_HARDFLOAT_2F64_USE_FP) {
        return (fpclassify(a.h) == FP_NORMAL || fpclassify(a.h) == FP_ZERO) &&
               (fpclassify(b.h) == FP_NORMAL || fpclassify(b.h) == FP_ZERO);
    }
    return float64_is_zero_or_normal(a.s) &&
           float64_is_zero_or_normal(b.s);
}